

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traverseephemeron(global_State *g,Table *h,int inv)

{
  byte bVar1;
  Node *pNVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  GCObject *local_58;
  uint local_3c;
  uint i;
  Node *limit;
  Node *n;
  int hasww;
  int hasclears;
  int marked;
  int inv_local;
  Table *h_local;
  global_State *g_local;
  
  hasww = 0;
  bVar4 = false;
  bVar3 = false;
  pNVar2 = h->node;
  bVar1 = h->lsizenode;
  local_3c = 0;
  do {
    if (h->sizearray <= local_3c) {
      limit = h->node;
      do {
        if (pNVar2 + (1 << (bVar1 & 0x1f)) <= limit) {
          if (g->gcstate == '\0') {
            if (9 < (h->tt & 0xf)) {
              __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                            ,0x253,"int traverseephemeron(global_State *, Table *, int)");
            }
            linkgclist_((GCObject *)h,&h->gclist,&g->grayagain);
          }
          else if (bVar3) {
            if (9 < (h->tt & 0xf)) {
              __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                            ,0x255,"int traverseephemeron(global_State *, Table *, int)");
            }
            linkgclist_((GCObject *)h,&h->gclist,&g->ephemeron);
          }
          else if (bVar4) {
            if (9 < (h->tt & 0xf)) {
              __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                            ,599,"int traverseephemeron(global_State *, Table *, int)");
            }
            linkgclist_((GCObject *)h,&h->gclist,&g->allweak);
          }
          else {
            if (9 < (h->tt & 0xf)) {
              __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                            ,0x259,"int traverseephemeron(global_State *, Table *, int)");
            }
            genlink(g,(GCObject *)h);
          }
          return hasww;
        }
        if ((limit->i_val).tt_ == 0) {
          removeentry(limit);
        }
        else {
          if (((limit->i_key).nk.tt_ & 0x8000) == 0) {
            local_58 = (GCObject *)0x0;
          }
          else {
            if (((limit->i_key).nk.tt_ & 0x8000) == 0) {
              __assert_fail("(((((const TValue*)((&(n)->i_key.tvk))))->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                            ,0x247,"int traverseephemeron(global_State *, Table *, int)");
            }
            local_58 = (limit->i_key).nk.value_.gc;
          }
          iVar5 = iscleared(g,local_58);
          if (iVar5 == 0) {
            if (((limit->i_val).tt_ & 0x8000) != 0) {
              if (((limit->i_val).tt_ & 0x8000) == 0) {
                __assert_fail("((((&(n)->i_val))->tt_) & (1 << 15))",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                              ,0x24c,"int traverseephemeron(global_State *, Table *, int)");
              }
              if ((((limit->i_val).value_.gc)->marked & 0x18) != 0) {
                hasww = 1;
                if (((limit->i_val).tt_ & 0x8000) == 0) {
                  __assert_fail("((((&(n)->i_val))->tt_) & (1 << 15))",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                                ,0x24e,"int traverseephemeron(global_State *, Table *, int)");
                }
                reallymarkobject(g,(limit->i_val).value_.gc);
              }
            }
          }
          else {
            bVar4 = true;
            if (((limit->i_val).tt_ & 0x8000) != 0) {
              if (((limit->i_val).tt_ & 0x8000) == 0) {
                __assert_fail("((((&(n)->i_val))->tt_) & (1 << 15))",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                              ,0x249,"int traverseephemeron(global_State *, Table *, int)");
              }
              if ((((limit->i_val).value_.gc)->marked & 0x18) != 0) {
                bVar3 = true;
              }
            }
          }
        }
        limit = limit + 1;
      } while( true );
    }
    if ((h->array[local_3c].tt_ & 0x8000) != 0) {
      if ((h->array[local_3c].tt_ & 0x8000) == 0) {
        __assert_fail("(((&h->array[i])->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x23e,"int traverseephemeron(global_State *, Table *, int)");
      }
      if (((h->array[local_3c].value_.gc)->marked & 0x18) != 0) {
        hasww = 1;
        if ((h->array[local_3c].tt_ & 0x8000) == 0) {
          __assert_fail("(((&h->array[i])->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x240,"int traverseephemeron(global_State *, Table *, int)");
        }
        reallymarkobject(g,h->array[local_3c].value_.gc);
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int marked = 0;  /* true if an object is marked in this traversal */
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  Node *n, *limit = gnodelast(h);
  unsigned int i;
  /* traverse array part */
  for (i = 0; i < h->sizearray; i++) {
    if (valiswhite(&h->array[i])) {
      marked = 1;
      reallymarkobject(g, gcvalue(&h->array[i]));
    }
  }
  /* traverse hash part */
  for (n = gnode(h, 0); n < limit; n++) {
    if (ttisnil(gval(n)))  /* entry is empty? */
      removeentry(n);  /* remove it */
    else if (iscleared(g, gcvalueN(gkey(n)))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}